

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

Status __thiscall leveldb::DBTest::TryReopen(DBTest *this,Options *options)

{
  long lVar1;
  undefined8 *in_RDX;
  Options *pOVar2;
  Options *pOVar3;
  int *piVar4;
  byte bVar5;
  Options opts;
  Options local_80;
  
  bVar5 = 0;
  if ((long *)options->block_size != (long *)0x0) {
    (**(code **)(*(long *)options->block_size + 8))();
  }
  options->block_size = 0;
  Options::Options(&opts);
  if (in_RDX == (undefined8 *)0x0) {
    CurrentOptions(&local_80,(DBTest *)options);
    pOVar2 = &local_80;
    pOVar3 = &opts;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar3->comparator = pOVar2->comparator;
      pOVar2 = (Options *)((long)pOVar2 + (ulong)bVar5 * -0x10 + 8);
      pOVar3 = (Options *)((long)pOVar3 + (ulong)bVar5 * -0x10 + 8);
    }
    opts.create_if_missing = true;
  }
  else {
    pOVar2 = &opts;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar2->comparator = (Comparator *)*in_RDX;
      in_RDX = in_RDX + (ulong)bVar5 * -2 + 1;
      pOVar2 = (Options *)((long)pOVar2 + (ulong)bVar5 * -0x10 + 8);
    }
  }
  pOVar2 = &opts;
  piVar4 = &options->block_restart_interval;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(Comparator **)piVar4 = pOVar2->comparator;
    pOVar2 = (Options *)((long)pOVar2 + (ulong)bVar5 * -0x10 + 8);
    piVar4 = piVar4 + (ulong)bVar5 * -4 + 2;
  }
  DB::Open((DB *)this,&opts,(string *)&options->env,(DB **)&options->block_size);
  return (Status)(char *)this;
}

Assistant:

Status TryReopen(Options* options) {
    delete db_;
    db_ = nullptr;
    Options opts;
    if (options != nullptr) {
      opts = *options;
    } else {
      opts = CurrentOptions();
      opts.create_if_missing = true;
    }
    last_options_ = opts;

    return DB::Open(opts, dbname_, &db_);
  }